

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

void __thiscall sentencepiece::SelfTestData::SelfTestData(SelfTestData *this,SelfTestData *from)

{
  void *pvVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = (void *)0x0;
  (this->_extensions_).arena_ = (Arena *)0x0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SelfTestData_002187f0;
  (this->_extensions_).flat_capacity_ = 0;
  (this->_extensions_).flat_size_ = 0;
  (this->_extensions_).map_.flat = (KeyValue *)0x0;
  google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::RepeatedPtrField
            (&this->samples_,&from->samples_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  google::protobuf::internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  return;
}

Assistant:

SelfTestData::SelfTestData(const SelfTestData& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      samples_(from.samples_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  // @@protoc_insertion_point(copy_constructor:sentencepiece.SelfTestData)
}